

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas_lite.c
# Opt level: O0

int sscal_(integer *n,real *sa,real *sx,integer *incx)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  integer i__2;
  integer i__1;
  integer *incx_local;
  real *sx_local;
  real *sa_local;
  integer *n_local;
  
  if ((0 < *n) && (0 < *incx)) {
    if (*incx == 1) {
      iVar3 = *n % 5;
      sscal_::m = iVar3;
      if (iVar3 != 0) {
        for (sscal_::i__ = 1; sscal_::i__ <= iVar3; sscal_::i__ = sscal_::i__ + 1) {
          sx[(long)sscal_::i__ + -1] = *sa * sx[(long)sscal_::i__ + -1];
        }
        if (*n < 5) {
          return 0;
        }
      }
      iVar3 = *n;
      sscal_::i__ = sscal_::m + 1;
      sscal_::mp1 = sscal_::i__;
      for (; sscal_::i__ <= iVar3; sscal_::i__ = sscal_::i__ + 5) {
        sx[(long)sscal_::i__ + -1] = *sa * sx[(long)sscal_::i__ + -1];
        sx[(long)(sscal_::i__ + 1) + -1] = *sa * sx[(long)(sscal_::i__ + 1) + -1];
        sx[(long)(sscal_::i__ + 2) + -1] = *sa * sx[(long)(sscal_::i__ + 2) + -1];
        sx[(long)(sscal_::i__ + 3) + -1] = *sa * sx[(long)(sscal_::i__ + 3) + -1];
        sx[(long)(sscal_::i__ + 4) + -1] = *sa * sx[(long)(sscal_::i__ + 4) + -1];
      }
    }
    else {
      iVar2 = *n * *incx;
      iVar3 = *incx;
      sscal_::i__ = 1;
      sscal_::nincx = iVar2;
      while( true ) {
        if (iVar3 < 0) {
          bVar1 = iVar2 <= sscal_::i__;
        }
        else {
          bVar1 = sscal_::i__ <= iVar2;
        }
        if (!bVar1) break;
        sx[(long)sscal_::i__ + -1] = *sa * sx[(long)sscal_::i__ + -1];
        sscal_::i__ = iVar3 + sscal_::i__;
      }
    }
  }
  return 0;
}

Assistant:

int sscal_(integer *n, real *sa, real *sx, integer *incx)
{
    /* System generated locals */
    integer i__1, i__2;

    /* Local variables */
    static integer i__, m, mp1, nincx;


/*
       scales a vector by a constant.
       uses unrolled loops for increment equal to 1.
       jack dongarra, linpack, 3/11/78.
       modified 3/93 to return if incx .le. 0.
       modified 12/3/93, array(1) declarations changed to array(*)
*/


    /* Parameter adjustments */
    --sx;

    /* Function Body */
    if (*n <= 0 || *incx <= 0) {
	return 0;
    }
    if (*incx == 1) {
	goto L20;
    }

/*        code for increment not equal to 1 */

    nincx = *n * *incx;
    i__1 = nincx;
    i__2 = *incx;
    for (i__ = 1; i__2 < 0 ? i__ >= i__1 : i__ <= i__1; i__ += i__2) {
	sx[i__] = *sa * sx[i__];
/* L10: */
    }
    return 0;

/*
          code for increment equal to 1


          clean-up loop
*/

L20:
    m = *n % 5;
    if (m == 0) {
	goto L40;
    }
    i__2 = m;
    for (i__ = 1; i__ <= i__2; ++i__) {
	sx[i__] = *sa * sx[i__];
/* L30: */
    }
    if (*n < 5) {
	return 0;
    }
L40:
    mp1 = m + 1;
    i__2 = *n;
    for (i__ = mp1; i__ <= i__2; i__ += 5) {
	sx[i__] = *sa * sx[i__];
	sx[i__ + 1] = *sa * sx[i__ + 1];
	sx[i__ + 2] = *sa * sx[i__ + 2];
	sx[i__ + 3] = *sa * sx[i__ + 3];
	sx[i__ + 4] = *sa * sx[i__ + 4];
/* L50: */
    }
    return 0;
}